

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationY<std::complex<double>_>::RotationY
          (RotationY<std::complex<double>_> *this,real_type theta)

{
  QRotationGate1<std::complex<double>_>::QRotationGate1
            (&this->super_QRotationGate1<std::complex<double>_>,0,theta,false);
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00136a68;
  return;
}

Assistant:

RotationY( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }